

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O3

size_t __thiscall
Potassco::ProgramOptions::DefaultFormat::format
          (DefaultFormat *this,vector<char,_std::allocator<char>_> *buffer,OptionGroup *grp)

{
  size_type sVar1;
  pointer pcVar2;
  undefined8 in_RAX;
  pointer pcVar3;
  pointer pcVar4;
  iterator iVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar6;
  
  pcVar4 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  if ((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pcVar4) {
    (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pcVar4;
  }
  sVar1 = (grp->caption_)._M_string_length;
  pcVar3 = pcVar4;
  if (sVar1 != 0) {
    std::vector<char,_std::allocator<char>_>::reserve(buffer,sVar1 + 4);
    uVar6 = CONCAT17(10,(int7)in_RAX);
    iVar5._M_current =
         (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar5._M_current ==
        (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                (buffer,iVar5,&stack0xffffffffffffffef);
      pcVar4 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
    else {
      *iVar5._M_current = '\n';
      pcVar4 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish + 1;
      (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pcVar4;
    }
    pcVar2 = (grp->caption_)._M_dataplus._M_p;
    std::vector<char,std::allocator<char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((vector<char,std::allocator<char>> *)buffer,pcVar4,pcVar2,
               pcVar2 + (grp->caption_)._M_string_length,in_R8,in_R9,uVar6);
    iVar5._M_current =
         (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar5._M_current ==
        (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                (buffer,iVar5,&stack0xffffffffffffffee);
      iVar5._M_current =
           (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
    }
    else {
      *iVar5._M_current = ':';
      iVar5._M_current =
           (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_finish + 1;
      (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar5._M_current;
    }
    if (iVar5._M_current ==
        (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                (buffer,iVar5,&stack0xffffffffffffffed);
      iVar5._M_current =
           (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
    }
    else {
      *iVar5._M_current = '\n';
      iVar5._M_current =
           (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_finish + 1;
      (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar5._M_current;
    }
    if (iVar5._M_current ==
        (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                (buffer,iVar5,&stack0xffffffffffffffec);
      pcVar4 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
    else {
      *iVar5._M_current = '\n';
      pcVar4 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish + 1;
      (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pcVar4;
    }
    pcVar3 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  return (long)pcVar4 - (long)pcVar3;
}

Assistant:

std::size_t DefaultFormat::format(std::vector<char>& buffer, const OptionGroup& grp) {
	buffer.clear();
	if (grp.caption().length()) {
		buffer.reserve(grp.caption().length() + 4);
		buffer.push_back('\n');
		buffer.insert(buffer.end(), grp.caption().begin(), grp.caption().end());
		buffer.push_back(':');
		buffer.push_back('\n');
		buffer.push_back('\n');
	}
	return buffer.size();
}